

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O0

void explorer::Explore<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(string *directory)

{
  initializer_list<uttt::IBoard> __l;
  bool bVar1;
  int level;
  int next_offset;
  int offset;
  int next_level;
  undefined4 in_stack_000001e0;
  int in_stack_000001e4;
  int in_stack_000001e8;
  int in_stack_000001ec;
  string *in_stack_000001f0;
  string *in_stack_000001f8;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_000002d8;
  string *in_stack_000002e0;
  int in_stack_00000314;
  int in_stack_00000318;
  int in_stack_0000031c;
  string *in_stack_00000320;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *this;
  iterator pIVar2;
  size_type in_stack_ffffffffffffffb0;
  string local_38 [36];
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  bVar1 = ReadLevelsFile(in_stack_000001f8,(int *)in_stack_000001f0,
                         (int *)CONCAT44(in_stack_000001ec,in_stack_000001e8),
                         (int *)CONCAT44(in_stack_000001e4,in_stack_000001e0));
  if (!bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
    uttt::IBoard::IBoard((IBoard *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    this = (vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&stack0xffffffffffffff88;
    pIVar2 = (iterator)0x1;
    std::allocator<uttt::IBoard>::allocator((allocator<uttt::IBoard> *)0x241f83);
    __l._M_len = in_stack_ffffffffffffffb0;
    __l._M_array = pIVar2;
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              (this,__l,(allocator_type *)in_stack_ffffffffffffff98);
    DumpToFile<uttt::IBoard,uttt::IBoardWriter>(in_stack_000002e0,in_stack_000002d8);
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~vector(in_stack_ffffffffffffff80);
    std::allocator<uttt::IBoard>::~allocator((allocator<uttt::IBoard> *)0x241fc2);
    std::__cxx11::string::~string(local_38);
    local_c = 1;
    local_10 = 0;
    local_14 = 0;
    WriteLevelsFile(in_stack_000001f0,in_stack_000001ec,in_stack_000001e8,in_stack_000001e4);
  }
  ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>
            (in_stack_00000320,in_stack_0000031c,in_stack_00000318,in_stack_00000314);
  do {
    ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>
              (in_stack_00000320,in_stack_0000031c,in_stack_00000318,in_stack_00000314);
  } while( true );
}

Assistant:

void
Explore(const std::string &directory)
{
    int next_level = 0, offset = 0, next_offset = 0;
    if (!ReadLevelsFile(directory, next_level, offset, next_offset))
    {
        DumpToFile<IGame, Writer>(directory + "/0_0", {{}});
        next_level = 1, offset = 0, next_offset = 0;
        WriteLevelsFile(directory, next_level, offset, next_offset);
    }

    ExploreLevel<IGame, Reader, Writer, Size>(directory, next_level, offset, next_offset);
    for (int level = next_level + 1; ; ++level)
        ExploreLevel<IGame, Reader, Writer, Size>(directory, level, 0, 0);
}